

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeerGateways.hpp
# Opt level: O0

void __thiscall
ableton::discovery::
PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::updateNodeState(PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
                  *this,pair<ableton::link::NodeState,_ableton::link::GhostXForm> *state)

{
  bool bVar1;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *this_00;
  anon_class_72_2_c759b39c_for_handler_ local_70;
  undefined1 local_28 [8];
  shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
  pCallback;
  pair<ableton::link::NodeState,_ableton::link::GhostXForm> *state_local;
  PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *this_local;
  
  pCallback.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)state;
  std::
  shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
  ::shared_ptr((shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
                *)local_28,&this->mpScannerCallback);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    this_00 = ableton::util::
              Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              ::operator->(&this->mIo);
    std::
    shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
    ::shared_ptr(&local_70.pCallback,
                 (shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
                  *)local_28);
    local_70.state.second.intercept.__r =
         (rep)pCallback.
              super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi[3]._vptr__Sp_counted_base;
    local_70.state.first.nodeId.super_NodeIdArray._M_elems =
         (NodeIdArray)
         (pCallback.
          super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    local_70.state.first.sessionId.super_NodeIdArray._M_elems =
         *(NodeIdArray *)
          &(pCallback.
            super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count;
    local_70.state.first.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (tuple<double>)
         pCallback.
         super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi[1]._vptr__Sp_counted_base;
    local_70.state.first.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
    super__Head_base<0UL,_long,_false>._M_head_impl._0_4_ =
         pCallback.
         super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi[1]._M_use_count;
    local_70.state.first.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
    super__Head_base<0UL,_long,_false>._M_head_impl._4_4_ =
         pCallback.
         super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi[1]._M_weak_count;
    local_70.state.first.timeline.timeOrigin.__r =
         (rep)pCallback.
              super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi[2]._vptr__Sp_counted_base;
    local_70.state.second.slope =
         *(double *)
          &pCallback.
           super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi[2]._M_use_count;
    ableton::platforms::asio::
    Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
    async<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::updateNodeState(std::pair<ableton::link::NodeState,ableton::link::GhostXForm>const&)::_lambda()_1_>
              ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)this_00,
               &local_70);
    PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>
    ::updateNodeState(std::pair<ableton::link::NodeState,ableton::link::GhostXForm>const&)::
    {lambda()#1}::~updateNodeState((_lambda___1_ *)&local_70);
  }
  std::
  shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
  ::~shared_ptr((shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
                 *)local_28);
  return;
}

Assistant:

void updateNodeState(const NodeState& state)
  {
    auto pCallback = mpScannerCallback;
    if (pCallback)
    {
      mIo->async([pCallback, state] {
        pCallback->mState = state;
        for (const auto& entry : pCallback->mGateways)
        {
          entry.second->updateNodeState(state);
        }
      });
    }
  }